

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O0

void __thiscall
script_segwit_tests::IsWitnessProgram_Invalid_Pushdata::test_method
          (IsWitnessProgram_Invalid_Pushdata *this)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_00;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first_01;
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  initializer_list<unsigned_char> __l_01;
  bool bVar1;
  const_iterator __position;
  iterator this_00;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffc68;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  undefined7 in_stack_fffffffffffffc78;
  undefined1 in_stack_fffffffffffffc7f;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  const_string *in_stack_fffffffffffffc90;
  size_type in_stack_fffffffffffffc98;
  size_t line_num;
  const_string *in_stack_fffffffffffffca0;
  const_string *file;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  const_iterator in_stack_fffffffffffffcb8;
  const_string local_248 [2];
  lazy_ostream local_228 [2];
  const_string local_1b8 [2];
  lazy_ostream local_198 [2];
  assertion_result local_178 [2];
  undefined1 local_139;
  uchar *local_138;
  const_string local_128 [2];
  lazy_ostream local_108 [2];
  assertion_result local_e8 [2];
  undefined1 local_a9;
  uchar *local_a8;
  const_string local_90;
  undefined1 local_75;
  undefined1 local_74;
  undefined1 local_73;
  undefined1 local_72;
  undefined1 local_71;
  undefined1 local_70;
  undefined1 local_6f;
  undefined1 local_6e;
  undefined1 local_6d;
  undefined1 local_6c;
  undefined1 local_6b;
  undefined1 local_6a;
  undefined1 local_69;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_6b = 0;
  local_6a = 0x4c;
  local_69 = 0x20;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc68);
  __l_01._M_array._7_1_ = in_stack_fffffffffffffcb7;
  __l_01._M_array._0_7_ = in_stack_fffffffffffffcb0;
  __l_01._M_len = (size_type)in_stack_fffffffffffffcb8._M_current;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffca8,__l_01,(allocator_type *)in_stack_fffffffffffffca0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffc68);
  local_a8 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                 CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  local_a9 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffcb8,CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88)
             ,in_stack_fffffffffffffc80._M_current);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (pointer)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    first._M_current._7_1_ = in_stack_fffffffffffffc8f;
    first._M_current._0_7_ = in_stack_fffffffffffffc88;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffffc68,first,in_stack_fffffffffffffc80);
    anon_unknown_20::IsNoWitnessProgram
              ((CScript *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (bool)in_stack_fffffffffffffc77);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (pointer)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (pointer)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (unsigned_long)in_stack_fffffffffffffc68);
    in_stack_fffffffffffffc68 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e8,local_108,local_128,0x99,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc68);
    CScript::~CScript((CScript *)in_stack_fffffffffffffc68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_6f = 0;
  local_6e = 0x4d;
  local_6d = 0x20;
  local_6c = 0;
  __l._M_len = in_stack_fffffffffffffc98;
  __l._M_array = (iterator)in_stack_fffffffffffffc90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),__l);
  local_138 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                 ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                  CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  local_139 = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffcb8,CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88)
             ,in_stack_fffffffffffffc80._M_current);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (pointer)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0,
               in_stack_fffffffffffffc98,in_stack_fffffffffffffc90);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    first_00._M_current._7_1_ = in_stack_fffffffffffffc8f;
    first_00._M_current._0_7_ = in_stack_fffffffffffffc88;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffffc68,first_00,in_stack_fffffffffffffc80);
    anon_unknown_20::IsNoWitnessProgram
              ((CScript *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (bool)in_stack_fffffffffffffc77);
    __position._M_current = (uchar *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (pointer)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (pointer)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (unsigned_long)in_stack_fffffffffffffc68);
    in_stack_fffffffffffffc68 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_178,local_198,local_1b8,0x9d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc68);
    CScript::~CScript((CScript *)in_stack_fffffffffffffc68);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_75 = 0;
  local_74 = 0x4e;
  local_73 = 0x20;
  local_72 = 0;
  local_71 = 0;
  local_70 = 0;
  __l_00._M_len = in_stack_fffffffffffffc98;
  __l_00._M_array = (iterator)in_stack_fffffffffffffc90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),__l_00);
  file = &local_90;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  this_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       in_stack_fffffffffffffc90,__position,
                       CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                       in_stack_fffffffffffffc80._M_current);
  do {
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (pointer)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00._M_current,file,line_num,in_stack_fffffffffffffc90);
    in_stack_fffffffffffffc90 = &local_90;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
    first_01._M_current._7_1_ = in_stack_fffffffffffffc8f;
    first_01._M_current._0_7_ = in_stack_fffffffffffffc88;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffffc68,first_01,in_stack_fffffffffffffc80);
    in_stack_fffffffffffffc8f =
         anon_unknown_20::IsNoWitnessProgram
                   ((CScript *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (bool)in_stack_fffffffffffffc77);
    in_stack_fffffffffffffc80._M_current = (uchar *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (pointer)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (unsigned_long)in_stack_fffffffffffffc68);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (basic_cstring<const_char> *)in_stack_fffffffffffffc68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78),
               (pointer)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70),
               (unsigned_long)in_stack_fffffffffffffc68);
    in_stack_fffffffffffffc68 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffdf8,local_228,local_248,0xa1,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffc68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc68);
    CScript::~CScript((CScript *)in_stack_fffffffffffffc68);
    in_stack_fffffffffffffc7f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffc7f);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffc7f,in_stack_fffffffffffffc78));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsWitnessProgram_Invalid_Pushdata)
{
    // A script is no witness program if OP_PUSHDATA is used to push the hash.
    std::vector<unsigned char> bytes = {OP_0, OP_PUSHDATA1, 32};
    bytes.insert(bytes.end(), 32, 0);
    BOOST_CHECK(IsNoWitnessProgram(CScript(bytes.begin(), bytes.end())));

    bytes = {OP_0, OP_PUSHDATA2, 32, 0};
    bytes.insert(bytes.end(), 32, 0);
    BOOST_CHECK(IsNoWitnessProgram(CScript(bytes.begin(), bytes.end())));

    bytes = {OP_0, OP_PUSHDATA4, 32, 0, 0, 0};
    bytes.insert(bytes.end(), 32, 0);
    BOOST_CHECK(IsNoWitnessProgram(CScript(bytes.begin(), bytes.end())));
}